

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void scaleSimplexCost(HighsOptions *options,HighsLp *lp,double *cost_scale)

{
  reference pvVar1;
  double *pdVar2;
  double *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar3;
  double dVar4;
  HighsInt iCol_1;
  double ln2;
  HighsInt iCol;
  double max_nonzero_cost;
  double max_allowed_cost_scale;
  int local_44;
  value_type local_38;
  int local_2c;
  HighsLogOptions *local_28;
  double local_20;
  double *local_18;
  int *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = pow(2.0,(double)*(int *)(in_RDI + 0x220));
  local_28 = (HighsLogOptions *)0x0;
  for (local_2c = 0; local_2c < *local_10; local_2c = local_2c + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_2c);
    if ((*pvVar1 != 0.0) || (NAN(*pvVar1))) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_2c);
      local_38 = ABS(*pvVar1);
      pdVar2 = std::max<double>(&local_38,(double *)&local_28);
      local_28 = (HighsLogOptions *)*pdVar2;
    }
  }
  *local_18 = 1.0;
  dVar3 = log(2.0);
  if ((0.0 < (double)local_28) && (((double)local_28 < 0.0625 || (16.0 < (double)local_28)))) {
    *local_18 = (double)local_28;
    dVar4 = log(*local_18);
    dVar3 = floor(dVar4 / dVar3 + 0.5);
    dVar3 = pow(2.0,dVar3);
    *local_18 = dVar3;
    pdVar2 = std::min<double>(local_18,&local_20);
    *local_18 = *pdVar2;
  }
  if ((*local_18 != 1.0) || (NAN(*local_18))) {
    for (local_44 = 0; local_44 < *local_10; local_44 = local_44 + 1) {
      dVar3 = *local_18;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_44);
      *pvVar1 = *pvVar1 / dVar3;
    }
    local_28 = (HighsLogOptions *)((double)local_28 / *local_18);
    highsLogUser((HighsLogOptions *)*local_18,(HighsLogType)local_28,(char *)(local_8 + 0x380),1,
                 "LP cost vector scaled down by %g: max cost is %g\n");
  }
  else {
    highsLogUser(local_28,(HighsLogType)(local_8 + 0x380),(char *)0x1,
                 "LP cost vector not scaled down: max cost is %g\n");
  }
  return;
}

Assistant:

void scaleSimplexCost(const HighsOptions& options, HighsLp& lp,
                      double& cost_scale) {
  // Scale the costs by no less than minAlwCostScale
  double max_allowed_cost_scale = pow(2.0, options.allowed_cost_scale_factor);
  double max_nonzero_cost = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (lp.col_cost_[iCol]) {
      max_nonzero_cost = max(fabs(lp.col_cost_[iCol]), max_nonzero_cost);
    }
  }
  // Scaling the costs up effectively increases the dual tolerance to
  // which the problem is solved - so, if the max cost is small the
  // scaling factor pushes it up by a power of 2 so it's close to 1
  // Scaling the costs down effectively decreases the dual tolerance
  // to which the problem is solved - so this can't be done too much
  cost_scale = 1;
  const double ln2 = log(2.0);
  // Scale if the max cost is positive and outside the range [1/16, 16]
  if ((max_nonzero_cost > 0) &&
      ((max_nonzero_cost < (1.0 / 16)) || (max_nonzero_cost > 16))) {
    cost_scale = max_nonzero_cost;
    cost_scale = pow(2.0, floor(log(cost_scale) / ln2 + 0.5));
    cost_scale = min(cost_scale, max_allowed_cost_scale);
  }
  if (cost_scale == 1) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "LP cost vector not scaled down: max cost is %g\n",
                 max_nonzero_cost);
    return;
  }
  // Scale the costs (and record of max_nonzero_cost) by cost_scale, being at
  // most max_allowed_cost_scale
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lp.col_cost_[iCol] /= cost_scale;
  }
  max_nonzero_cost /= cost_scale;
  highsLogUser(options.log_options, HighsLogType::kInfo,
               "LP cost vector scaled down by %g: max cost is %g\n", cost_scale,
               max_nonzero_cost);
}